

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<double> * __thiscall Imath_3_2::Matrix33<double>::transposed(Matrix33<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Matrix33<double> *in_RDI;
  
  dVar1 = this->x[1][0];
  dVar2 = this->x[2][0];
  dVar3 = this->x[0][1];
  dVar4 = this->x[1][1];
  dVar5 = this->x[2][1];
  dVar6 = this->x[0][2];
  dVar7 = this->x[1][2];
  dVar8 = this->x[2][2];
  in_RDI->x[0][0] = this->x[0][0];
  in_RDI->x[0][1] = dVar1;
  in_RDI->x[0][2] = dVar2;
  in_RDI->x[1][0] = dVar3;
  in_RDI->x[1][1] = dVar4;
  in_RDI->x[1][2] = dVar5;
  in_RDI->x[2][0] = dVar6;
  in_RDI->x[2][1] = dVar7;
  in_RDI->x[2][2] = dVar8;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix33<T>
Matrix33<T>::transposed () const IMATH_NOEXCEPT
{
    return Matrix33 (
        x[0][0],
        x[1][0],
        x[2][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[0][2],
        x[1][2],
        x[2][2]);
}